

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O2

double __thiscall Timer::stop(Timer *this)

{
  double dVar1;
  double dVar2;
  
  dVar1 = now(this->m_measureWallclockTime);
  dVar1 = dVar1 - this->m_startTime;
  dVar2 = 0.0;
  if (0.0 <= dVar1) {
    dVar2 = dVar1;
  }
  this->m_lastLap = dVar2;
  return dVar2;
}

Assistant:

double stop() {
		double stop = now(m_measureWallclockTime);
		m_lastLap = stop - m_startTime;

		// avoid rare cases of non-increasing timer values (cf. eg. http://www.linuxmisc.com/8-freebsd/d4c6ddc8fbfbd523.htm)

		if ( m_lastLap < 0.0 ) {
			m_lastLap = 0.0;
		}

		return m_lastLap;
	}